

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::setStandardInputFile(QProcess *this,QString *fileName)

{
  QBindingStatus **this_00;
  QObjectData *pQVar1;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  this_00 = &pQVar1[4].bindingStorage.bindingStatus;
  QProcessPrivate::Channel::clear((Channel *)this_00);
  QString::operator=((QString *)this_00,fileName);
  *(char *)&pQVar1[5].children.d.size = ((fileName->d).size != 0) * '\x03';
  return;
}

Assistant:

void QProcess::setStandardInputFile(const QString &fileName)
{
    Q_D(QProcess);
    d->stdinChannel = fileName;
}